

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  RandJoinClauseSyntax *pRVar1;
  Info *args_2;
  Token TVar2;
  Token TVar3;
  BumpAllocator *in_stack_00000108;
  Token *in_stack_00000110;
  BumpAllocator *in_stack_ffffffffffffffb8;
  BumpAllocator *this;
  
  this = (BumpAllocator *)__child_stack;
  TVar2 = parsing::Token::deepClone(in_stack_00000110,in_stack_00000108);
  TVar3 = parsing::Token::deepClone(in_stack_00000110,in_stack_00000108);
  args_2 = TVar3.info;
  if (*(long *)(__fn + 0x38) != 0) {
    deepClone<slang::syntax::ParenthesizedExpressionSyntax>
              ((ParenthesizedExpressionSyntax *)__child_stack,in_stack_ffffffffffffffb8);
  }
  pRVar1 = BumpAllocator::
           emplace<slang::syntax::RandJoinClauseSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::ParenthesizedExpressionSyntax*>
                     (this,(Token *)TVar2.info,TVar2._0_8_,(ParenthesizedExpressionSyntax **)args_2)
  ;
  return (int)pRVar1;
}

Assistant:

static SyntaxNode* clone(const RandJoinClauseSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<RandJoinClauseSyntax>(
        node.rand.deepClone(alloc),
        node.join.deepClone(alloc),
        node.expr ? deepClone(*node.expr, alloc) : nullptr
    );
}